

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localintermediate.h
# Opt level: O0

void __thiscall glslang::TIntermediate::setSourceFile(TIntermediate *this,char *file)

{
  char *file_local;
  TIntermediate *this_local;
  
  if (file != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->sourceFile,file);
  }
  return;
}

Assistant:

void setSourceFile(const char* file) { if (file != nullptr) sourceFile = file; }